

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9HashmapWalk(jx9_hashmap *pMap,_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk,
                    void *pUserData)

{
  jx9_hashmap_node *pNode;
  int iVar1;
  sxu32 sVar2;
  jx9_hashmap_node **ppjVar3;
  bool bVar4;
  jx9_value sValue;
  jx9_value sKey;
  
  jx9MemObjInit(pMap->pVm,&sKey);
  jx9MemObjInit(pMap->pVm,&sValue);
  sVar2 = pMap->nEntry;
  ppjVar3 = &pMap->pFirst;
  while( true ) {
    bVar4 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar4) {
      return 0;
    }
    pNode = *ppjVar3;
    jx9HashmapExtractNodeKey(pNode,&sKey);
    jx9HashmapExtractNodeValue(pNode,&sValue,0);
    iVar1 = (*xWalk)(&sKey,&sValue,pUserData);
    jx9MemObjRelease(&sKey);
    jx9MemObjRelease(&sValue);
    if (iVar1 != 0) break;
    ppjVar3 = &pNode->pPrev;
  }
  return -10;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapWalk(
	jx9_hashmap *pMap, /* Target hashmap */
	int (*xWalk)(jx9_value *, jx9_value *, void *), /* Walker callback */
	void *pUserData /* Last argument to xWalk() */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sKey, sValue;
	sxi32 rc;
	sxu32 n;
	/* Initialize walker parameter */
	rc = SXRET_OK;
	jx9MemObjInit(pMap->pVm, &sKey);
	jx9MemObjInit(pMap->pVm, &sValue);
	n = pMap->nEntry;
	pEntry = pMap->pFirst;
	/* Start the iteration process */
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract a copy of the key and a copy the current value */
		jx9HashmapExtractNodeKey(pEntry, &sKey);
		jx9HashmapExtractNodeValue(pEntry, &sValue, FALSE);
		/* Invoke the user callback */
		rc = xWalk(&sKey, &sValue, pUserData);
		/* Release the copy of the key and the value */
		jx9MemObjRelease(&sKey);
		jx9MemObjRelease(&sValue);
		if( rc != JX9_OK ){
			/* Callback request an operation abort */
			return SXERR_ABORT;
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* All done */
	return SXRET_OK;
}